

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O0

void nn_fsm_init_root(nn_fsm *self,nn_fsm_fn fn,nn_fsm_fn shutdown_fn,nn_ctx *ctx)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  *(undefined4 *)(in_RDI + 2) = 1;
  *(undefined4 *)((long)in_RDI + 0x14) = 0xffffffff;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = in_RCX;
  nn_fsm_event_init((nn_fsm_event *)0x1d28a1);
  return;
}

Assistant:

void nn_fsm_init_root (struct nn_fsm *self, nn_fsm_fn fn,
    nn_fsm_fn shutdown_fn, struct nn_ctx *ctx)
{
    self->fn = fn;
    self->shutdown_fn = shutdown_fn;
    self->state = NN_FSM_STATE_IDLE;
    self->src = -1;
    self->srcptr = NULL;
    self->owner = NULL;
    self->ctx = ctx;
    nn_fsm_event_init (&self->stopped);
}